

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O3

matrix sptk::swipe::loudness(vector x,vector fERBs,double nyquist,int w,int w2)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  double *extraout_RDX_02;
  double *pdVar11;
  undefined4 in_register_00000084;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int i;
  double *pdVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  matrix L;
  vector f;
  vector f_00;
  vector f_01;
  vector vVar21;
  matrix L_00;
  matrix mVar22;
  vector yr_vector;
  vector yr_vector_00;
  vector fERBs_00;
  vector fERBs_01;
  vector fERBs_02;
  double **local_168;
  allocator_type local_149;
  ulong local_148;
  int local_13c;
  double *local_138;
  double *local_130;
  long local_128;
  long local_120;
  ulong local_118;
  undefined8 local_110;
  uint local_104;
  vector<double,_std::allocator<double>_> fi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  fo;
  Buffer buffer;
  RealValuedFastFourierTransform plan;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *extraout_RDX_01;
  
  uVar12 = CONCAT44(in_register_00000084,w);
  local_138 = fERBs.v;
  local_130 = x.v;
  uVar7 = (ulong)(uint)w2;
  local_13c = x.x;
  std::vector<double,_std::allocator<double>_>::vector(&fi,(long)w,(allocator_type *)&plan);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&plan,(long)w,(allocator_type *)&buffer);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&fo,2,(value_type *)&plan,&local_149);
  if (plan._vptr_RealValuedFastFourierTransform != (_func_int **)0x0) {
    operator_delete(plan._vptr_RealValuedFastFourierTransform);
  }
  RealValuedFastFourierTransform::RealValuedFastFourierTransform(&plan,w2 * 2 + -1,w2 * 2);
  buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00136c68;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar21 = makev(w);
  pdVar9 = vVar21.v;
  local_104 = vVar21.x;
  uVar5 = (ulong)(uint)w;
  if (0 < w) {
    uVar13 = 0;
    do {
      dVar17 = cos(((double)(int)uVar13 / (double)w) * 6.283185307179586);
      pdVar9[uVar13] = dVar17 * -0.5 + 0.5;
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
  }
  vVar21 = makev(w2);
  auVar2 = _DAT_0012bcc0;
  pdVar10 = vVar21.v;
  uVar3 = vVar21.x;
  pdVar11 = pdVar10;
  if (0 < w2) {
    dVar17 = nyquist / (double)w2;
    lVar14 = uVar7 - 1;
    auVar18._8_4_ = (int)lVar14;
    auVar18._0_8_ = lVar14;
    auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar13 = 0;
    auVar18 = auVar18 ^ _DAT_0012bcc0;
    auVar19 = _DAT_0012bcb0;
    do {
      auVar20 = auVar19 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        pdVar10[uVar13] = (double)(int)uVar13 * dVar17;
      }
      uVar1 = -(ushort)(auVar20._12_4_ == auVar18._12_4_ && auVar18._8_4_ < auVar20._8_4_ ||
                       auVar18._12_4_ < auVar20._12_4_) ^ 0xffff;
      pdVar11 = (double *)(ulong)uVar1;
      if ((uVar1 & 1) != 0) {
        pdVar10[uVar13 + 1] = (double)((int)uVar13 + 1) * dVar17;
        pdVar11 = pdVar10;
      }
      uVar13 = uVar13 + 2;
      lVar14 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar14 + 2;
    } while ((w2 + 1U & 0xfffffffe) != uVar13);
  }
  vVar21.v = pdVar11;
  vVar21._0_8_ = pdVar10;
  iVar4 = bisectv((swipe *)(ulong)uVar3,vVar21,*local_138);
  local_110 = CONCAT44(extraout_var,iVar4);
  dVar17 = ceil((double)local_13c / (double)w2);
  L_00 = makem((int)(dVar17 + 1.0),fERBs.x);
  if (w2 < 1) {
    uVar6 = 0;
  }
  else {
    memset(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start,0,uVar7 << 3);
    uVar6 = w2;
  }
  if ((int)uVar6 < w) {
    uVar13 = (ulong)uVar6;
    do {
      fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = local_130[uVar13 - (long)w2] * pdVar9[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
  }
  f._4_4_ = 0;
  f.x = uVar3;
  f.v = pdVar10;
  fERBs_00.v = local_138;
  fERBs_00._0_8_ = uVar12;
  La(L_00,f,fERBs_00,&plan,&fi,&fo,&buffer,w2,(int)local_110,0);
  local_118 = uVar7;
  if (L_00.x < 4) {
    iVar4 = 1;
    lVar14 = 0;
    pdVar11 = extraout_RDX;
    local_148 = L_00._0_8_;
  }
  else {
    iVar4 = L_00.x + -2;
    local_120 = (long)w2;
    local_128 = local_120 * 8;
    i = 1;
    lVar14 = 0;
    pdVar11 = local_130;
    do {
      local_168 = L_00.m;
      local_148 = L_00._0_8_;
      if (0 < w) {
        uVar7 = 0;
        do {
          fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar7] = pdVar11[uVar7] * pdVar9[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      f_00._4_4_ = 0;
      f_00.x = uVar3;
      f_00.v = pdVar10;
      fERBs_01.v = local_138;
      fERBs_01._0_8_ = uVar12;
      La(L_00,f_00,fERBs_01,&plan,&fi,&fo,&buffer,(int)local_118,(int)local_110,i);
      L_00.m = local_168;
      L_00.x = (undefined4)local_148;
      L_00.y = local_148._4_4_;
      lVar14 = lVar14 + local_120;
      i = i + 1;
      pdVar11 = (double *)((long)pdVar11 + local_128);
    } while (i != iVar4);
    lVar14 = (long)(int)lVar14;
    pdVar11 = extraout_RDX_00;
  }
  uVar7 = local_148;
  local_168 = L_00.m;
  if (iVar4 < L_00.x) {
    lVar15 = (long)(int)local_118;
    local_120 = (long)local_13c;
    pdVar16 = local_130 + lVar14;
    local_128 = lVar15 * 8;
    do {
      uVar5 = 0;
      if (lVar14 < local_120) {
        uVar5 = 0;
        do {
          fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] = pdVar16[uVar5] * pdVar9[uVar5];
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < local_120 - lVar14);
      }
      if ((int)(uint)uVar5 < w) {
        memset(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar5 & 0xffffffff),0,
               (ulong)(~(uint)uVar5 + w) * 8 + 8);
      }
      uVar5 = local_148;
      f_01._4_4_ = 0;
      f_01.x = uVar3;
      L.m = local_168;
      local_148._0_4_ = (undefined4)uVar7;
      local_148._4_4_ = SUB84(uVar7,4);
      L.x = (undefined4)local_148;
      L.y = local_148._4_4_;
      f_01.v = pdVar10;
      fERBs_02.v = local_138;
      fERBs_02._0_8_ = uVar12;
      local_148 = uVar5;
      La(L,f_01,fERBs_02,&plan,&fi,&fo,&buffer,(int)local_118,(int)local_110,iVar4);
      lVar14 = lVar14 + lVar15;
      iVar4 = iVar4 + 1;
      pdVar16 = (double *)((long)pdVar16 + local_128);
      pdVar11 = extraout_RDX_01;
    } while (iVar4 != (int)uVar7);
  }
  yr_vector.v = pdVar11;
  yr_vector._0_8_ = pdVar9;
  freev((swipe *)(ulong)local_104,yr_vector);
  uVar7 = local_148;
  yr_vector_00.v = extraout_RDX_02;
  yr_vector_00._0_8_ = pdVar10;
  freev((swipe *)(ulong)uVar3,yr_vector_00);
  uVar5 = local_148;
  if (0 < (int)uVar7) {
    uVar7 = local_148 >> 0x20;
    uVar3 = (uint)local_148;
    uVar13 = 0;
    do {
      iVar4 = (int)(uVar5 >> 0x20);
      if (0 < iVar4) {
        dVar17 = 0.0;
        uVar8 = 0;
        do {
          dVar17 = dVar17 + local_168[uVar13][uVar8] * local_168[uVar13][uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          if (iVar4 != 0 && -1 < (long)uVar5) {
            pdVar9 = local_168[uVar13];
            uVar8 = 0;
            do {
              pdVar9[uVar8] = pdVar9[uVar8] / dVar17;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar3 & 0x7fffffff));
  }
  RealValuedFastFourierTransform::Buffer::~Buffer(&buffer);
  RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&plan);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&fo);
  if (fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(fi.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  mVar22.m = local_168;
  mVar22.x = (undefined4)local_148;
  mVar22.y = local_148._4_4_;
  return mVar22;
}

Assistant:

matrix loudness(vector x, vector fERBs, double nyquist, int w, int w2) {
    int i, j, hi; 
    int offset = 0;
    double td = nyquist / w2; // this is equivalent to fstep
    // testing showed this configuration of fftw to be fastest
#if 0
    double* fi = fftw_malloc(sizeof(double) * w); 
    fftw_complex* fo = fftw_malloc(sizeof(fftw_complex) * w);
    fftw_plan plan = fftw_plan_dft_r2c_1d(w, fi, fo, FFTW_ESTIMATE); 
#else
    std::vector<double> fi(w); 
    std::vector<std::vector<double> > fo(2, std::vector<double>(w));
    sptk::RealValuedFastFourierTransform plan(w2 * 2 - 1, w2 * 2);
    sptk::RealValuedFastFourierTransform::Buffer buffer;
#endif
    vector hann = makev(w); // this defines the Hann[ing] window
    for (i = 0; i < w; i++) 
        hann.v[i] = .5 - (.5 * cos(2. * M_PI * ((double) i / w)));
    vector f = makev(w2);
    for (i = 0; i < w2; i++) 
        f.v[i] = i * td;
    hi = bisectv(f, fERBs.v[0]); // all calls to La() will begin here
    matrix L = makem(ceil((double) x.x / w2) + 1, fERBs.x); 
    for (j = 0; j < w2; j++) // left boundary case
        fi[j] = 0.; // more explicitly, 0. * hann.v[j]
    for (/* j = w2 */; j < w; j++) 
        fi[j] = x.v[j - w2] * hann.v[j];
#if 0
    La(L, f, fERBs, plan, fo, w2, hi, 0); 
#else
    La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, 0); 
#endif
    for (i = 1; i < L.x - 2; i++) { 
        for (j = 0; j < w; j++) 
            fi[j] = x.v[j + offset] * hann.v[j];
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i); 
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i); 
#endif
        offset += w2;
    }
    for (/* i = L.x - 2; */; i < L.x; i++) { // right two boundary cases
        for (j = 0; j < x.x - offset; j++) // this dies at x.x + w2
            fi[j] = x.v[j + offset] * hann.v[j];
        for (/* j = x.x - offset */; j < w; j++) 
            fi[j] = 0.; // once again, 0. * hann.v[j] 
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i);
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i);
#endif
        offset += w2;
    } // now L is fully valued
    freev(hann);
    freev(f);
    // L must now be normalized
    for (i = 0; i < L.x; i++) { 
        td = 0.; // td is the value of the normalization factor
        for (j = 0; j < L.y; j++) 
            td += L.m[i][j] * L.m[i][j];
        if (td != 0.) { // catches zero-division
            td = sqrt(td);
            for (j = 0; j < L.y; j++) 
                L.m[i][j] /= td;
        } // otherwise, it is already 0.
    } 
#if 0
    fftw_destroy_plan(plan); 
    fftw_free(fi); 
    fftw_free(fo); 
#endif
    return(L);
}